

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

string * __thiscall
argparse::Argument::get_usage_full_abi_cxx11_(string *__return_storage_ptr__,Argument *this)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  allocator<char> local_1f1;
  string local_1f0 [8];
  string metavar;
  string local_1c0;
  stringstream local_1a0 [8];
  stringstream usage;
  ostream local_190 [376];
  Argument *local_18;
  Argument *this_local;
  
  local_18 = this;
  this_local = (Argument *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  get_names_csv_abi_cxx11_(&local_1c0,this,'/');
  std::operator<<(local_190,(string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->m_metavar);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_1f0,"VAR",&local_1f1);
    std::allocator<char>::~allocator(&local_1f1);
  }
  else {
    std::__cxx11::string::string(local_1f0,&this->m_metavar);
  }
  sVar2 = NArgsRange::get_max(&this->m_num_args_range);
  if (sVar2 != 0) {
    poVar3 = std::operator<<(local_190," ");
    std::operator<<(poVar3,local_1f0);
    sVar2 = NArgsRange::get_max(&this->m_num_args_range);
    if (1 < sVar2) {
      std::operator<<(local_190,"...");
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string get_usage_full() const {
    std::stringstream usage;

    usage << get_names_csv('/');
    const std::string metavar = !m_metavar.empty() ? m_metavar : "VAR";
    if (m_num_args_range.get_max() > 0) {
      usage << " " << metavar;
      if (m_num_args_range.get_max() > 1) {
        usage << "...";
      }
    }
    return usage.str();
  }